

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# get_value_pointer_bug_t.c
# Opt level: O1

void test_one_ip(MMDB_s *mmdb,char *filename,char *mode_desc,char *ip,char *country_code)

{
  int iVar1;
  ulong uVar2;
  char *__s1;
  ulong uVar3;
  ulong __n;
  MMDB_entry_data_s entry_data;
  MMDB_lookup_result_s result;
  MMDB_entry_data_s local_78;
  MMDB_lookup_result_s local_40;
  
  lookup_string_ok(&local_40,mmdb,ip,filename,mode_desc);
  data_ok(&local_78,&local_40,2,"country{iso_code}","country","iso_code",0);
  iVar1 = ok_at_loc("/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/get_value_pointer_bug_t.c"
                    ,0x20,(uint)local_78.has_data,"found data for country{iso_code}",0);
  if (iVar1 != 0) {
    uVar2 = (ulong)local_78.data_size;
    uVar3 = 0;
    __n = uVar3;
    if (uVar2 != 0) {
      do {
        __n = uVar3;
        if (local_78.field_1.utf8_string[uVar3] == '\0') break;
        uVar3 = uVar3 + 1;
        __n = uVar2;
      } while (uVar2 != uVar3);
    }
    __s1 = (char *)malloc(__n + 1);
    if (__s1 == (char *)0x0) {
      __s1 = (char *)0x0;
    }
    else {
      memcpy(__s1,local_78.field_1.utf8_string,__n);
      __s1[__n] = '\0';
    }
    if (__s1 == (char *)0x0) {
      ok_at_loc("/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/get_value_pointer_bug_t.c"
                ,0x24,0,"mmdb_strndup() call failed",0);
      exit(1);
    }
    iVar1 = strcmp(__s1,country_code);
    iVar1 = ok_at_loc("/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/get_value_pointer_bug_t.c"
                      ,0x29,(uint)(iVar1 == 0),"iso_code is %s",country_code,0);
    if (iVar1 == 0) {
      diag("  value is %s",__s1);
    }
    free(__s1);
  }
  return;
}

Assistant:

void test_one_ip(MMDB_s *mmdb,
                 const char *filename,
                 const char *mode_desc,
                 char *ip,
                 char *country_code) {
    MMDB_lookup_result_s result =
        lookup_string_ok(mmdb, ip, filename, mode_desc);

    MMDB_entry_data_s entry_data = data_ok(&result,
                                           MMDB_DATA_TYPE_UTF8_STRING,
                                           "country{iso_code}",
                                           "country",
                                           "iso_code",
                                           NULL);

    if (ok(entry_data.has_data, "found data for country{iso_code}")) {
        char *string =
            mmdb_strndup(entry_data.utf8_string, entry_data.data_size);
        if (!string) {
            ok(0, "mmdb_strndup() call failed");
            exit(1);
        }
        if (!ok(strcmp(string, country_code) == 0,
                "iso_code is %s",
                country_code)) {
            diag("  value is %s", string);
        }
        free(string);
    }
}